

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression_impl.cc
# Opt level: O2

void __thiscall
webrtc::NoiseSuppressionImpl::Suppressor::Suppressor(Suppressor *this,int sample_rate_hz)

{
  int v2;
  NsHandle *NS_inst;
  string *result;
  ostream *poVar1;
  FatalMessage FStack_188;
  
  this->state_ = (NsState *)0x0;
  NS_inst = WebRtcNs_Create();
  this->state_ = NS_inst;
  if (NS_inst == (NsHandle *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&FStack_188,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
               ,0x23);
    poVar1 = std::operator<<((ostream *)&FStack_188,"Check failed: state_");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<(poVar1,"# ");
    rtc::FatalMessage::~FatalMessage(&FStack_188);
  }
  v2 = WebRtcNs_Init(NS_inst,sample_rate_hz);
  result = rtc::CheckEQImpl_abi_cxx11_(0,v2,"0 == error");
  if (result == (string *)0x0) {
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&FStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
             ,0x25,result);
  rtc::FatalMessage::~FatalMessage(&FStack_188);
}

Assistant:

explicit Suppressor(int sample_rate_hz) {
    state_ = NS_CREATE();
    RTC_CHECK(state_);
    int error = NS_INIT(state_, sample_rate_hz);
    RTC_DCHECK_EQ(0, error);
  }